

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O2

int StartOtherScanRequestRPLIDAR(RPLIDAR *pRPLIDAR,int scanmodeid)

{
  int iVar1;
  uchar *esdataresponse;
  char *__s;
  int DataType;
  int SendMode;
  int DataResponseLength;
  uchar reqbuf [9];
  
  reqbuf[8] = '\0';
  DataResponseLength = 0;
  SendMode = 0;
  DataType = 0;
  reqbuf[3] = (uchar)scanmodeid;
  reqbuf[0] = 0xa5;
  reqbuf[1] = 0x82;
  reqbuf[2] = '\x05';
  reqbuf[4] = '\0';
  reqbuf[5] = '\0';
  reqbuf[6] = '\0';
  reqbuf[7] = '\0';
  reqbuf[8] = ComputeChecksumRPLIDAR(reqbuf,9);
  iVar1 = WriteAllRS232Port(&pRPLIDAR->RS232Port,reqbuf,9);
  if (iVar1 != 0) {
    puts("Error writing data to a RPLIDAR. ");
    return 1;
  }
  iVar1 = GetResponseDescriptorRPLIDAR(pRPLIDAR,&DataResponseLength,&SendMode,&DataType);
  if (iVar1 != 0) {
    return 1;
  }
  if ((((DataResponseLength == 0x54 || DataResponseLength == 0x84) && (SendMode == 1)) &&
      (DataType - 0x82U < 4)) && (DataType - 0x82U != 1)) {
    iVar1 = WaitForRS232Port(&pRPLIDAR->RS232Port,0x5dc,5);
    if (iVar1 == 0) {
      pRPLIDAR->esversion = DataType;
      if (DataType == 0x85) {
        esdataresponse = pRPLIDAR->desdata_prev;
        pRPLIDAR->desdata_prev[0x40] = '\0';
        pRPLIDAR->desdata_prev[0x41] = '\0';
        pRPLIDAR->desdata_prev[0x42] = '\0';
        pRPLIDAR->desdata_prev[0x43] = '\0';
        pRPLIDAR->desdata_prev[0x44] = '\0';
        pRPLIDAR->desdata_prev[0x45] = '\0';
        pRPLIDAR->desdata_prev[0x46] = '\0';
        pRPLIDAR->desdata_prev[0x47] = '\0';
        pRPLIDAR->desdata_prev[0x48] = '\0';
        pRPLIDAR->desdata_prev[0x49] = '\0';
        pRPLIDAR->desdata_prev[0x4a] = '\0';
        pRPLIDAR->desdata_prev[0x4b] = '\0';
        pRPLIDAR->desdata_prev[0x4c] = '\0';
        pRPLIDAR->desdata_prev[0x4d] = '\0';
        pRPLIDAR->desdata_prev[0x4e] = '\0';
        pRPLIDAR->desdata_prev[0x4f] = '\0';
        pRPLIDAR->desdata_prev[0x30] = '\0';
        pRPLIDAR->desdata_prev[0x31] = '\0';
        pRPLIDAR->desdata_prev[0x32] = '\0';
        pRPLIDAR->desdata_prev[0x33] = '\0';
        pRPLIDAR->desdata_prev[0x34] = '\0';
        pRPLIDAR->desdata_prev[0x35] = '\0';
        pRPLIDAR->desdata_prev[0x36] = '\0';
        pRPLIDAR->desdata_prev[0x37] = '\0';
        pRPLIDAR->desdata_prev[0x38] = '\0';
        pRPLIDAR->desdata_prev[0x39] = '\0';
        pRPLIDAR->desdata_prev[0x3a] = '\0';
        pRPLIDAR->desdata_prev[0x3b] = '\0';
        pRPLIDAR->desdata_prev[0x3c] = '\0';
        pRPLIDAR->desdata_prev[0x3d] = '\0';
        pRPLIDAR->desdata_prev[0x3e] = '\0';
        pRPLIDAR->desdata_prev[0x3f] = '\0';
        pRPLIDAR->desdata_prev[0x20] = '\0';
        pRPLIDAR->desdata_prev[0x21] = '\0';
        pRPLIDAR->desdata_prev[0x22] = '\0';
        pRPLIDAR->desdata_prev[0x23] = '\0';
        pRPLIDAR->desdata_prev[0x24] = '\0';
        pRPLIDAR->desdata_prev[0x25] = '\0';
        pRPLIDAR->desdata_prev[0x26] = '\0';
        pRPLIDAR->desdata_prev[0x27] = '\0';
        pRPLIDAR->desdata_prev[0x28] = '\0';
        pRPLIDAR->desdata_prev[0x29] = '\0';
        pRPLIDAR->desdata_prev[0x2a] = '\0';
        pRPLIDAR->desdata_prev[0x2b] = '\0';
        pRPLIDAR->desdata_prev[0x2c] = '\0';
        pRPLIDAR->desdata_prev[0x2d] = '\0';
        pRPLIDAR->desdata_prev[0x2e] = '\0';
        pRPLIDAR->desdata_prev[0x2f] = '\0';
        pRPLIDAR->desdata_prev[0x10] = '\0';
        pRPLIDAR->desdata_prev[0x11] = '\0';
        pRPLIDAR->desdata_prev[0x12] = '\0';
        pRPLIDAR->desdata_prev[0x13] = '\0';
        pRPLIDAR->desdata_prev[0x14] = '\0';
        pRPLIDAR->desdata_prev[0x15] = '\0';
        pRPLIDAR->desdata_prev[0x16] = '\0';
        pRPLIDAR->desdata_prev[0x17] = '\0';
        pRPLIDAR->desdata_prev[0x18] = '\0';
        pRPLIDAR->desdata_prev[0x19] = '\0';
        pRPLIDAR->desdata_prev[0x1a] = '\0';
        pRPLIDAR->desdata_prev[0x1b] = '\0';
        pRPLIDAR->desdata_prev[0x1c] = '\0';
        pRPLIDAR->desdata_prev[0x1d] = '\0';
        pRPLIDAR->desdata_prev[0x1e] = '\0';
        pRPLIDAR->desdata_prev[0x1f] = '\0';
        pRPLIDAR->desdata_prev[0] = '\0';
        pRPLIDAR->desdata_prev[1] = '\0';
        pRPLIDAR->desdata_prev[2] = '\0';
        pRPLIDAR->desdata_prev[3] = '\0';
        pRPLIDAR->desdata_prev[4] = '\0';
        pRPLIDAR->desdata_prev[5] = '\0';
        pRPLIDAR->desdata_prev[6] = '\0';
        pRPLIDAR->desdata_prev[7] = '\0';
        pRPLIDAR->desdata_prev[8] = '\0';
        pRPLIDAR->desdata_prev[9] = '\0';
        pRPLIDAR->desdata_prev[10] = '\0';
        pRPLIDAR->desdata_prev[0xb] = '\0';
        pRPLIDAR->desdata_prev[0xc] = '\0';
        pRPLIDAR->desdata_prev[0xd] = '\0';
        pRPLIDAR->desdata_prev[0xe] = '\0';
        pRPLIDAR->desdata_prev[0xf] = '\0';
        pRPLIDAR->desdata_prev[0x50] = '\0';
        pRPLIDAR->desdata_prev[0x51] = '\0';
        pRPLIDAR->desdata_prev[0x52] = '\0';
        pRPLIDAR->desdata_prev[0x53] = '\0';
      }
      else {
        if (DataType == 0x84) {
          memset(pRPLIDAR->eesdata_prev,0,0x84);
          iVar1 = GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR,pRPLIDAR->eesdata_prev,0x84);
          if (iVar1 != 0) {
            return 1;
          }
          puts(
              "A RPLIDAR is not responding correctly : Unhandled response descriptor, please try another scan mode or rebuild using RPLIDAR SDK. "
              );
          return 0x11;
        }
        if (DataType != 0x82) {
          __s = "A RPLIDAR is not responding correctly : Unhandled response descriptor. ";
          goto LAB_00177f01;
        }
        esdataresponse = pRPLIDAR->esdata_prev;
        pRPLIDAR->esdata_prev[0x40] = '\0';
        pRPLIDAR->esdata_prev[0x41] = '\0';
        pRPLIDAR->esdata_prev[0x42] = '\0';
        pRPLIDAR->esdata_prev[0x43] = '\0';
        pRPLIDAR->esdata_prev[0x44] = '\0';
        pRPLIDAR->esdata_prev[0x45] = '\0';
        pRPLIDAR->esdata_prev[0x46] = '\0';
        pRPLIDAR->esdata_prev[0x47] = '\0';
        pRPLIDAR->esdata_prev[0x48] = '\0';
        pRPLIDAR->esdata_prev[0x49] = '\0';
        pRPLIDAR->esdata_prev[0x4a] = '\0';
        pRPLIDAR->esdata_prev[0x4b] = '\0';
        pRPLIDAR->esdata_prev[0x4c] = '\0';
        pRPLIDAR->esdata_prev[0x4d] = '\0';
        pRPLIDAR->esdata_prev[0x4e] = '\0';
        pRPLIDAR->esdata_prev[0x4f] = '\0';
        pRPLIDAR->esdata_prev[0x30] = '\0';
        pRPLIDAR->esdata_prev[0x31] = '\0';
        pRPLIDAR->esdata_prev[0x32] = '\0';
        pRPLIDAR->esdata_prev[0x33] = '\0';
        pRPLIDAR->esdata_prev[0x34] = '\0';
        pRPLIDAR->esdata_prev[0x35] = '\0';
        pRPLIDAR->esdata_prev[0x36] = '\0';
        pRPLIDAR->esdata_prev[0x37] = '\0';
        pRPLIDAR->esdata_prev[0x38] = '\0';
        pRPLIDAR->esdata_prev[0x39] = '\0';
        pRPLIDAR->esdata_prev[0x3a] = '\0';
        pRPLIDAR->esdata_prev[0x3b] = '\0';
        pRPLIDAR->esdata_prev[0x3c] = '\0';
        pRPLIDAR->esdata_prev[0x3d] = '\0';
        pRPLIDAR->esdata_prev[0x3e] = '\0';
        pRPLIDAR->esdata_prev[0x3f] = '\0';
        pRPLIDAR->esdata_prev[0x20] = '\0';
        pRPLIDAR->esdata_prev[0x21] = '\0';
        pRPLIDAR->esdata_prev[0x22] = '\0';
        pRPLIDAR->esdata_prev[0x23] = '\0';
        pRPLIDAR->esdata_prev[0x24] = '\0';
        pRPLIDAR->esdata_prev[0x25] = '\0';
        pRPLIDAR->esdata_prev[0x26] = '\0';
        pRPLIDAR->esdata_prev[0x27] = '\0';
        pRPLIDAR->esdata_prev[0x28] = '\0';
        pRPLIDAR->esdata_prev[0x29] = '\0';
        pRPLIDAR->esdata_prev[0x2a] = '\0';
        pRPLIDAR->esdata_prev[0x2b] = '\0';
        pRPLIDAR->esdata_prev[0x2c] = '\0';
        pRPLIDAR->esdata_prev[0x2d] = '\0';
        pRPLIDAR->esdata_prev[0x2e] = '\0';
        pRPLIDAR->esdata_prev[0x2f] = '\0';
        pRPLIDAR->esdata_prev[0x10] = '\0';
        pRPLIDAR->esdata_prev[0x11] = '\0';
        pRPLIDAR->esdata_prev[0x12] = '\0';
        pRPLIDAR->esdata_prev[0x13] = '\0';
        pRPLIDAR->esdata_prev[0x14] = '\0';
        pRPLIDAR->esdata_prev[0x15] = '\0';
        pRPLIDAR->esdata_prev[0x16] = '\0';
        pRPLIDAR->esdata_prev[0x17] = '\0';
        pRPLIDAR->esdata_prev[0x18] = '\0';
        pRPLIDAR->esdata_prev[0x19] = '\0';
        pRPLIDAR->esdata_prev[0x1a] = '\0';
        pRPLIDAR->esdata_prev[0x1b] = '\0';
        pRPLIDAR->esdata_prev[0x1c] = '\0';
        pRPLIDAR->esdata_prev[0x1d] = '\0';
        pRPLIDAR->esdata_prev[0x1e] = '\0';
        pRPLIDAR->esdata_prev[0x1f] = '\0';
        pRPLIDAR->esdata_prev[0] = '\0';
        pRPLIDAR->esdata_prev[1] = '\0';
        pRPLIDAR->esdata_prev[2] = '\0';
        pRPLIDAR->esdata_prev[3] = '\0';
        pRPLIDAR->esdata_prev[4] = '\0';
        pRPLIDAR->esdata_prev[5] = '\0';
        pRPLIDAR->esdata_prev[6] = '\0';
        pRPLIDAR->esdata_prev[7] = '\0';
        pRPLIDAR->esdata_prev[8] = '\0';
        pRPLIDAR->esdata_prev[9] = '\0';
        pRPLIDAR->esdata_prev[10] = '\0';
        pRPLIDAR->esdata_prev[0xb] = '\0';
        pRPLIDAR->esdata_prev[0xc] = '\0';
        pRPLIDAR->esdata_prev[0xd] = '\0';
        pRPLIDAR->esdata_prev[0xe] = '\0';
        pRPLIDAR->esdata_prev[0xf] = '\0';
        pRPLIDAR->esdata_prev[0x50] = '\0';
        pRPLIDAR->esdata_prev[0x51] = '\0';
        pRPLIDAR->esdata_prev[0x52] = '\0';
        pRPLIDAR->esdata_prev[0x53] = '\0';
      }
      iVar1 = GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR,esdataresponse,0x54);
      if (iVar1 != 0) {
        return 1;
      }
      return 0;
    }
    __s = "A RPLIDAR is not responding correctly. ";
  }
  else {
    __s = "A RPLIDAR is not responding correctly : Bad response descriptor. ";
  }
LAB_00177f01:
  puts(__s);
  return 1;
}

Assistant:

inline int StartOtherScanRequestRPLIDAR(RPLIDAR* pRPLIDAR, int scanmodeid)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
	if (SL_IS_FAIL(pRPLIDAR->drv->startScanExpress(false, (unsigned short)scanmodeid)))
	{
		printf("A RPLIDAR is not responding correctly : startScanExpress() failed. \n");
		return EXIT_FAILURE;
	}
#else
	unsigned char reqbuf[] = {START_FLAG1_RPLIDAR,EXPRESS_SCAN_REQUEST_RPLIDAR,0x05,0,0,0,0,0,0};
	int DataResponseLength = 0, SendMode = 0, DataType = 0;

	reqbuf[3] = (unsigned char)scanmodeid;
	reqbuf[8] = ComputeChecksumRPLIDAR(reqbuf, sizeof(reqbuf));

	// Send request.
	if (WriteAllRS232Port(&pRPLIDAR->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a RPLIDAR. \n");
		return EXIT_FAILURE;
	}

	// Receive the response descriptor.
	if (GetResponseDescriptorRPLIDAR(pRPLIDAR, &DataResponseLength, &SendMode, &DataType) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Quick check of the response descriptor.
	if (((DataResponseLength != NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR)&&(DataResponseLength != NB_BYTES_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR)&&(DataResponseLength != NB_BYTES_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR))||
		(SendMode != SINGLE_REQUEST_MULTIPLE_RESPONSE_SEND_MODE_RPLIDAR)||
		((DataType != MEASUREMENT_CAPSULED_RESPONSE_RPLIDAR)&&(DataType != MEASUREMENT_CAPSULED_ULTRA_RESPONSE_RPLIDAR)&&(DataType != MEASUREMENT_DENSE_CAPSULED_RESPONSE_RPLIDAR)))
	{ 
		printf("A RPLIDAR is not responding correctly : Bad response descriptor. \n");
		return EXIT_FAILURE;	
	}

	// The first data response might take some time to come, see https://github.com/ENSTABretagneRobotics/Hardware-MATLAB/issues/2...
	if (WaitForRS232Port(&pRPLIDAR->RS232Port, 1500, 5) != EXIT_SUCCESS)
	{
		printf("A RPLIDAR is not responding correctly. \n");
		return EXIT_FAILURE;
	}

	pRPLIDAR->esversion = DataType;

	// Receive the first data response (2 data responses needed for angles computation...).
	switch (pRPLIDAR->esversion)
	{
	case MEASUREMENT_CAPSULED_RESPONSE_RPLIDAR:
		PRINT_DEBUG_MESSAGE(("RPLIDAR Legacy Express Scan\n"));
		memset(pRPLIDAR->esdata_prev, 0, sizeof(pRPLIDAR->esdata_prev));
		if (GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR, pRPLIDAR->esdata_prev, NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		break;
	case MEASUREMENT_CAPSULED_ULTRA_RESPONSE_RPLIDAR:
		PRINT_DEBUG_MESSAGE(("RPLIDAR Extended Express Scan\n"));
		memset(pRPLIDAR->eesdata_prev, 0, sizeof(pRPLIDAR->eesdata_prev));
		if (GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR, pRPLIDAR->eesdata_prev, NB_BYTES_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}

		// Need to update GetOtherScanDataResponseRPLIDAR()...

		printf("A RPLIDAR is not responding correctly : Unhandled response descriptor, please try another scan mode or rebuild using RPLIDAR SDK. \n");
		return EXIT_NOT_IMPLEMENTED;
		//break;
	case MEASUREMENT_DENSE_CAPSULED_RESPONSE_RPLIDAR:
		PRINT_DEBUG_MESSAGE(("RPLIDAR Dense Express Scan\n"));
		memset(pRPLIDAR->desdata_prev, 0, sizeof(pRPLIDAR->desdata_prev));
		if (GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR, pRPLIDAR->desdata_prev, NB_BYTES_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		break;
	default:
		printf("A RPLIDAR is not responding correctly : Unhandled response descriptor. \n");
		return EXIT_FAILURE;
		//break;
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT
	return EXIT_SUCCESS;
}